

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O2

void __thiscall
Js::DebugContext::WalkAndAddUtf8SourceInfo
          (DebugContext *this,Utf8SourceInfo *sourceInfo,
          List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
          *utf8SourceInfoList)

{
  uint uVar1;
  ScriptContext *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  code *pcVar3;
  bool bVar4;
  Utf8SourceInfo *pUVar5;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar6;
  undefined4 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Utf8SourceInfo *local_38;
  Utf8SourceInfo *sourceInfo_local;
  
  local_38 = sourceInfo;
  pUVar5 = Utf8SourceInfo::GetCallerUtf8SourceInfo(sourceInfo);
  if (pUVar5 != (Utf8SourceInfo *)0x0) {
    this_00 = (pUVar5->m_scriptContext).ptr;
    Output::Trace(DebuggerPhase,
                  L"DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"
                  ,this->scriptContext,sourceInfo,pUVar5,(sourceInfo->m_scriptContext).ptr,this_00);
    if ((sourceInfo->m_scriptContext).ptr == this_00) {
      WalkAndAddUtf8SourceInfo(this,pUVar5,utf8SourceInfoList);
    }
    else {
      bVar4 = ScriptContext::IsScriptContextInNonDebugMode(this_00);
      if (bVar4) {
        ScriptContext::AddCalleeSourceInfoToList(this_00,sourceInfo);
      }
    }
  }
  bVar4 = JsUtil::ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>::
          Contains(&utf8SourceInfoList->
                    super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>
                   ,&local_38);
  if (!bVar4) {
    uVar10 = 0;
    Output::Trace(DebuggerPhase,
                  L"DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"
                  ,this->scriptContext,local_38,(local_38->m_scriptContext).ptr);
    pLVar6 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->scriptContext->sourceList);
    uVar1 = (pLVar6->
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
            ).count;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar10;
    }
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      pRVar2 = (pLVar6->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[uVar9].ptr;
      if (((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
        pUVar5 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef;
        uVar10 = (ulong)(byte)((byte)uVar10 |
                              (local_38 == pUVar5 && pUVar5 != (Utf8SourceInfo *)0x0));
      }
    }
    if (uVar10 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                  ,0x1b0,"(found)","Parented eval feature have extra source");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    JsUtil::
    List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
    ::Add(utf8SourceInfoList,&local_38);
  }
  return;
}

Assistant:

void DebugContext::WalkAndAddUtf8SourceInfo(Js::Utf8SourceInfo* sourceInfo, JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer> *utf8SourceInfoList)
    {
        Js::Utf8SourceInfo* callerUtf8SourceInfo = sourceInfo->GetCallerUtf8SourceInfo();
        if (callerUtf8SourceInfo)
        {
            Js::ScriptContext* callerScriptContext = callerUtf8SourceInfo->GetScriptContext();
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, callerUtf8SourceInfo, sourceInfo->GetScriptContext(), callerScriptContext);

            if (sourceInfo->GetScriptContext() == callerScriptContext)
            {
                WalkAndAddUtf8SourceInfo(callerUtf8SourceInfo, utf8SourceInfoList);
            }
            else if (callerScriptContext->IsScriptContextInNonDebugMode())
            {
                // The caller scriptContext is not in run down/debug mode so let's save the relationship so that we can re-parent callees afterwards.
                callerScriptContext->AddCalleeSourceInfoToList(sourceInfo);
            }
        }
        if (!utf8SourceInfoList->Contains(sourceInfo))
        {
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, sourceInfo->GetScriptContext());
#if DBG
            bool found = false;
            this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfoTemp) -> bool
            {
                if (sourceInfoTemp == sourceInfo)
                {
                    found = true;
                }
                return found;
            });
            AssertMsg(found, "Parented eval feature have extra source");
#endif
            utf8SourceInfoList->Add(sourceInfo);
        }
    }